

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O1

void __thiscall
CountOverJoin::valueCount(CountOverJoin *this,Union *factorisationNode,DTreeNode *dTreeNode)

{
  uint uVar1;
  DTreeNode *dTreeNode_00;
  ulong uVar2;
  long lVar3;
  long lVar4;
  DTreeNode **ppDVar5;
  ulong uVar6;
  
  if (dTreeNode->_caching == true) {
    if (this->cachedCounts[factorisationNode->cacheIndex] != 0) {
      return;
    }
    this->cachedCounts[factorisationNode->cacheIndex] = 1;
  }
  this->numberOfValues = this->numberOfValues + factorisationNode->numberOfValues;
  if (factorisationNode->numberOfValues != 0) {
    uVar1 = dTreeNode->_numOfChildren;
    lVar4 = 0;
    uVar2 = 0;
    do {
      lVar3 = lVar4;
      ppDVar5 = &dTreeNode->_firstChild;
      uVar6 = (ulong)uVar1;
      if (0 < (int)uVar1) {
        do {
          dTreeNode_00 = *ppDVar5;
          valueCount(this,*(Union **)((long)factorisationNode->children + lVar3),dTreeNode_00);
          ppDVar5 = &dTreeNode_00->_next;
          lVar3 = lVar3 + 8;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + (long)(int)uVar1 * 8;
    } while (uVar2 < factorisationNode->numberOfValues);
  }
  return;
}

Assistant:

void CountOverJoin::valueCount(node::Union* factorisationNode, DTreeNode* dTreeNode)
{
    if (dTreeNode->_caching)
    {
        if (cachedCounts[factorisationNode->cacheIndex] > 0)
            return;

        cachedCounts[factorisationNode->cacheIndex] = 1;
    }

    numberOfValues += factorisationNode->numberOfValues;

    int numOfChildren = dTreeNode -> _numOfChildren;
    for (unsigned long val = 0; val < factorisationNode->numberOfValues; ++val)
    {
        DTreeNode* child = dTreeNode->_firstChild; 
        for (int i = 0; i < numOfChildren; ++i)
        {
            valueCount(factorisationNode->children[val * numOfChildren + i], child);
            child = child->_next;
        }
    }
}